

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O3

void nrg::PrioExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  _func_void *local_60;
  undefined8 uStack_58;
  code *local_50;
  undefined8 uStack_48;
  QueueElement local_40;
  
  uStack_58 = 0;
  if (fn == (_func_void *)0x0) {
    local_40.what.super__Function_base._M_functor._M_unused._M_object = (_func_void *)0x0;
    local_40.what.super__Function_base._M_manager = (_Manager_type)0x0;
    local_40.what._M_invoker = (_Invoker_type)0x0;
  }
  else {
    local_40.what._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_40.what.super__Function_base._M_manager =
         std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    local_40.what.super__Function_base._M_functor._M_unused._M_function_pointer = fn;
  }
  local_40._0_8_ = (ulong)next()::nxt << 0x20;
  local_40.what.super__Function_base._M_functor._8_8_ = 0;
  uStack_48 = 0;
  local_50 = (code *)0x0;
  next()::nxt = next()::nxt + 1;
  local_60 = (_func_void *)local_40.what.super__Function_base._M_functor._M_unused._0_8_;
  std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>::
  emplace_back<nrg::PrioExecution::QueueElement>(&queue->c,&local_40);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::PrioExecution::QueueElement*,std::vector<nrg::PrioExecution::QueueElement,std::allocator<nrg::PrioExecution::QueueElement>>>,std::greater<nrg::PrioExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_40.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_40.what.super__Function_base._M_manager)
              ((_Any_data *)&local_40.what,(_Any_data *)&local_40.what,__destroy_functor);
  }
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }